

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regtrav.c
# Opt level: O3

int capture_tree_traverse
              (OnigCaptureTreeNode *node,int at,
              _func_int_int_int_int_int_int_void_ptr *callback_func,int level,void *arg)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = 0;
  if ((node != (OnigCaptureTreeNode *)0x0) &&
     ((uVar3 = (ulong)(uint)level, (at & 1U) == 0 ||
      (iVar1 = (*callback_func)(node->group,node->beg,node->end,level,1,arg), iVar1 == 0)))) {
    if (0 < node->num_childs) {
      iVar1 = level + 1;
      lVar4 = 0;
      do {
        iVar2 = capture_tree_traverse(node->childs[lVar4],at,callback_func,iVar1,arg);
        level = (int)uVar3;
        if (iVar2 != 0) {
          return iVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < node->num_childs);
    }
    if (((at & 2U) == 0) ||
       (iVar1 = (*callback_func)(node->group,node->beg,node->end,level,2,arg), iVar1 == 0)) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
capture_tree_traverse(OnigCaptureTreeNode* node, int at,
                      int(*callback_func)(int,int,int,int,int,void*),
                      int level, void* arg)
{
  int r, i;

  if (node == (OnigCaptureTreeNode* )0)
    return 0;

  if ((at & ONIG_TRAVERSE_CALLBACK_AT_FIRST) != 0) {
    r = (*callback_func)(node->group, node->beg, node->end,
                         level, ONIG_TRAVERSE_CALLBACK_AT_FIRST, arg);
    if (r != 0) return r;
  }

  for (i = 0; i < node->num_childs; i++) {
    r = capture_tree_traverse(node->childs[i], at,
                              callback_func, level + 1, arg);
    if (r != 0) return r;
  }

  if ((at & ONIG_TRAVERSE_CALLBACK_AT_LAST) != 0) {
    r = (*callback_func)(node->group, node->beg, node->end,
                         level, ONIG_TRAVERSE_CALLBACK_AT_LAST, arg);
    if (r != 0) return r;
  }

  return 0;
}